

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_vsnprintf(char *buf,int buf_size,char *fmt,__va_list_tag *args)

{
  double n_00;
  uint uVar1;
  bool bVar2;
  nk_flags nVar3;
  int iVar4;
  char *pcVar5;
  bool bVar6;
  int local_358;
  int local_354;
  int local_340;
  nk_flags local_33c;
  int local_330;
  nk_flags local_32c;
  int local_320;
  double *local_318;
  int local_2f8;
  nk_flags local_2f4;
  int local_2ec;
  nk_flags local_2e8;
  int local_2e0;
  nk_flags local_2dc;
  nk_flags local_2d4;
  uint *local_2c8;
  ulong *local_2b0;
  uint *local_298;
  uint *local_280;
  char *local_268;
  uint local_260;
  int local_25c;
  nk_flags local_258;
  nk_flags local_250;
  int local_248;
  nk_flags local_244;
  int local_23c;
  nk_flags local_238;
  int *local_230;
  uint *local_218;
  undefined8 *local_200;
  undefined4 *local_1e8;
  undefined4 *local_1d0;
  int local_1b8;
  nk_flags local_1b4;
  long *local_1b0;
  long *local_198;
  nk_flags *local_180;
  int *local_168;
  int local_150;
  int padding_2;
  int dot;
  int frac_len;
  int num_len_2;
  double value_2;
  int cur_width_2;
  int prefix;
  int cur_precision_2;
  char *num_iter_1;
  int digit;
  char *output_format;
  char *lower_output_format;
  char *upper_output_format;
  uint base;
  int cur_width_1;
  int cur_precision_1;
  int padding_1;
  int num_print_1;
  int num_len_1;
  unsigned_long value_1;
  int cur_width;
  int cur_precision;
  int padding;
  int num_print;
  int num_len;
  char *num_iter;
  long value;
  int *n;
  char *str;
  char *end_1;
  char *end;
  char *iter;
  int result;
  int len;
  nk_flags flag;
  int width;
  int precision;
  nk_arg_type arg_type;
  char number_buffer [64];
  __va_list_tag *args_local;
  char *fmt_local;
  int buf_size_local;
  char *buf_local;
  
  width = 2;
  flag = 0xffffffff;
  len = -1;
  result = 0;
  iter._4_4_ = 0;
  iter._0_4_ = 0xffffffff;
  end = fmt;
  if (buf == (char *)0x0) {
    __assert_fail("buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x1ab8,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
  }
  if (buf_size == 0) {
    __assert_fail("buf_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x1ab9,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
  }
  if (((buf == (char *)0x0) || (buf_size == 0)) || (fmt == (char *)0x0)) {
    buf_local._4_4_ = 0;
  }
  else {
    for (; *end != '\0' && iter._4_4_ < buf_size; end = end + 1) {
      while( true ) {
        bVar2 = false;
        if ((*end != '\0') && (bVar2 = false, *end != '%')) {
          bVar2 = iter._4_4_ < buf_size;
        }
        if (!bVar2) break;
        buf[iter._4_4_] = *end;
        end = end + 1;
        iter._4_4_ = iter._4_4_ + 1;
      }
      if ((*end == '\0') || (pcVar5 = end, buf_size <= iter._4_4_)) break;
      while (end = pcVar5 + 1, *end != '\0') {
        if (*end == '-') {
          result = result | 1;
          pcVar5 = end;
        }
        else if (*end == '+') {
          result = result | 2;
          pcVar5 = end;
        }
        else if (*end == ' ') {
          result = result | 4;
          pcVar5 = end;
        }
        else if (*end == '#') {
          result = result | 0x10;
          pcVar5 = end;
        }
        else {
          if (*end != '0') break;
          result = result | 0x20;
          pcVar5 = end;
        }
      }
      len = -1;
      if ((*end < '1') || ('9' < *end)) {
        if (*end == '*') {
          uVar1 = args->gp_offset;
          if (uVar1 < 0x29) {
            local_168 = (int *)((long)(int)uVar1 + (long)args->reg_save_area);
            args->gp_offset = uVar1 + 8;
          }
          else {
            local_168 = (int *)args->overflow_arg_area;
            args->overflow_arg_area = local_168 + 2;
          }
          len = *local_168;
          end = pcVar5 + 2;
        }
      }
      else {
        len = nk_strtoi(end,&end_1);
        if (end_1 == end) {
          len = -1;
        }
        else {
          end = end_1;
        }
      }
      flag = 0xffffffff;
      if (*end == '.') {
        pcVar5 = end + 1;
        if (*pcVar5 == '*') {
          uVar1 = args->gp_offset;
          if (uVar1 < 0x29) {
            local_180 = (nk_flags *)((long)(int)uVar1 + (long)args->reg_save_area);
            args->gp_offset = uVar1 + 8;
          }
          else {
            local_180 = (nk_flags *)args->overflow_arg_area;
            args->overflow_arg_area = local_180 + 2;
          }
          flag = *local_180;
          end = end + 2;
        }
        else {
          end = pcVar5;
          flag = nk_strtoi(pcVar5,&str);
          if (str == end) {
            flag = 0xffffffff;
          }
          else {
            end = str;
          }
        }
      }
      if (*end == 'h') {
        pcVar5 = end + 1;
        if (*pcVar5 == 'h') {
          end = end + 1;
        }
        width = (int)(*pcVar5 != 'h');
        end = end + 1;
      }
      else if (*end == 'l') {
        width = 3;
        end = end + 1;
      }
      else {
        width = 2;
      }
      if (*end == '%') {
        if (width != 2) {
          __assert_fail("arg_type == NK_ARG_TYPE_DEFAULT",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                        ,0x1af8,
                        "int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
        }
        if (flag != 0xffffffff) {
          __assert_fail("precision == (-1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                        ,0x1af9,
                        "int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
        }
        if (len != -1) {
          __assert_fail("width == (-1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                        ,0x1afa,
                        "int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
        }
        if (iter._4_4_ < buf_size) {
          buf[iter._4_4_] = '%';
          iter._4_4_ = iter._4_4_ + 1;
        }
      }
      else if (*end == 's') {
        uVar1 = args->gp_offset;
        if (uVar1 < 0x29) {
          local_198 = (long *)((long)(int)uVar1 + (long)args->reg_save_area);
          args->gp_offset = uVar1 + 8;
        }
        else {
          local_198 = (long *)args->overflow_arg_area;
          args->overflow_arg_area = local_198 + 1;
        }
        n = (int *)*local_198;
        if (n == (int *)buf) {
          __assert_fail("str != buf && \"buffer and argument are not allowed to overlap!\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                        ,0x1b00,
                        "int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
        }
        if (width != 2) {
          __assert_fail("arg_type == NK_ARG_TYPE_DEFAULT",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                        ,0x1b01,
                        "int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
        }
        if (flag != 0xffffffff) {
          __assert_fail("precision == (-1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                        ,0x1b02,
                        "int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
        }
        if (len != -1) {
          __assert_fail("width == (-1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                        ,0x1b03,
                        "int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
        }
        if (n == (int *)buf) {
          return -1;
        }
        while( true ) {
          bVar2 = false;
          if ((n != (int *)0x0) && (bVar2 = false, (char)*n != '\0')) {
            bVar2 = iter._4_4_ < buf_size;
          }
          if (!bVar2) break;
          buf[iter._4_4_] = (char)*n;
          n = (int *)((long)n + 1);
          iter._4_4_ = iter._4_4_ + 1;
        }
      }
      else if (*end == 'n') {
        uVar1 = args->gp_offset;
        if (uVar1 < 0x29) {
          local_1b0 = (long *)((long)(int)uVar1 + (long)args->reg_save_area);
          args->gp_offset = uVar1 + 8;
        }
        else {
          local_1b0 = (long *)args->overflow_arg_area;
          args->overflow_arg_area = local_1b0 + 1;
        }
        if (width != 2) {
          __assert_fail("arg_type == NK_ARG_TYPE_DEFAULT",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                        ,0x1b0a,
                        "int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
        }
        if (flag != 0xffffffff) {
          __assert_fail("precision == (-1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                        ,0x1b0b,
                        "int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
        }
        if (len != -1) {
          __assert_fail("width == (-1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                        ,0x1b0c,
                        "int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
        }
        if ((int *)*local_1b0 != (int *)0x0) {
          *(int *)*local_1b0 = iter._4_4_;
        }
      }
      else if (((*end == 'c') || (*end == 'i')) || (*end == 'd')) {
        if ((int)flag < 1) {
          local_1b4 = 1;
        }
        else {
          local_1b4 = flag;
        }
        if (len < 0) {
          local_1b8 = 0;
        }
        else {
          local_1b8 = len;
        }
        if (width == 0) {
          uVar1 = args->gp_offset;
          if (uVar1 < 0x29) {
            local_1d0 = (undefined4 *)((long)(int)uVar1 + (long)args->reg_save_area);
            args->gp_offset = uVar1 + 8;
          }
          else {
            local_1d0 = (undefined4 *)args->overflow_arg_area;
            args->overflow_arg_area = local_1d0 + 2;
          }
          num_iter = (char *)(long)(char)*local_1d0;
        }
        else if (width == 1) {
          uVar1 = args->gp_offset;
          if (uVar1 < 0x29) {
            local_1e8 = (undefined4 *)((long)(int)uVar1 + (long)args->reg_save_area);
            args->gp_offset = uVar1 + 8;
          }
          else {
            local_1e8 = (undefined4 *)args->overflow_arg_area;
            args->overflow_arg_area = local_1e8 + 2;
          }
          num_iter = (char *)(long)(short)*local_1e8;
        }
        else if (width == 3) {
          uVar1 = args->gp_offset;
          if (uVar1 < 0x29) {
            local_200 = (undefined8 *)((long)(int)uVar1 + (long)args->reg_save_area);
            args->gp_offset = uVar1 + 8;
          }
          else {
            local_200 = (undefined8 *)args->overflow_arg_area;
            args->overflow_arg_area = local_200 + 1;
          }
          num_iter = (char *)*local_200;
        }
        else if (*end == 'c') {
          uVar1 = args->gp_offset;
          if (uVar1 < 0x29) {
            local_218 = (uint *)((long)(int)uVar1 + (long)args->reg_save_area);
            args->gp_offset = uVar1 + 8;
          }
          else {
            local_218 = (uint *)args->overflow_arg_area;
            args->overflow_arg_area = local_218 + 2;
          }
          num_iter = (char *)(ulong)(*local_218 & 0xff);
        }
        else {
          uVar1 = args->gp_offset;
          if (uVar1 < 0x29) {
            local_230 = (int *)((long)(int)uVar1 + (long)args->reg_save_area);
            args->gp_offset = uVar1 + 8;
          }
          else {
            local_230 = (int *)args->overflow_arg_area;
            args->overflow_arg_area = local_230 + 2;
          }
          num_iter = (char *)(long)*local_230;
        }
        nk_itoa((char *)&precision,(long)num_iter);
        nVar3 = nk_strlen((char *)&precision);
        local_238 = nVar3;
        if ((int)nVar3 <= (int)local_1b4) {
          local_238 = local_1b4;
        }
        if ((int)(local_1b8 - local_238) < 0) {
          local_23c = 0;
        }
        else {
          local_244 = nVar3;
          if ((int)nVar3 <= (int)local_1b4) {
            local_244 = local_1b4;
          }
          local_23c = local_1b8 - local_244;
        }
        cur_width = local_23c;
        if (((result & 2U) != 0) || ((result & 4U) != 0)) {
          if (local_23c + -1 < 0) {
            local_248 = 0;
          }
          else {
            local_248 = local_23c + -1;
          }
          cur_width = local_248;
        }
        if ((result & 1U) == 0) {
          for (; iVar4 = cur_width + -1, bVar2 = 0 < cur_width, cur_width = iVar4,
              bVar2 && iter._4_4_ < buf_size; iter._4_4_ = iter._4_4_ + 1) {
            if (((result & 0x20U) == 0) || (flag != 0xffffffff)) {
              buf[iter._4_4_] = ' ';
            }
            else {
              buf[iter._4_4_] = '0';
            }
          }
        }
        if ((((result & 2U) == 0) || ((long)num_iter < 0)) || (buf_size <= iter._4_4_)) {
          if ((((result & 4U) != 0) && (-1 < (long)num_iter)) && (iter._4_4_ < buf_size)) {
            buf[iter._4_4_] = ' ';
            iter._4_4_ = iter._4_4_ + 1;
          }
        }
        else {
          buf[iter._4_4_] = '+';
          iter._4_4_ = iter._4_4_ + 1;
        }
        local_250 = nVar3;
        if ((int)nVar3 <= (int)local_1b4) {
          local_250 = local_1b4;
        }
        cur_precision = local_250;
        while( true ) {
          bVar2 = false;
          if ((flag != 0) && (bVar2 = false, (int)nVar3 < cur_precision)) {
            bVar2 = iter._4_4_ < buf_size;
          }
          if (!bVar2) break;
          buf[iter._4_4_] = '0';
          cur_precision = cur_precision + -1;
          iter._4_4_ = iter._4_4_ + 1;
        }
        _num_print = &precision;
        while( true ) {
          bVar2 = false;
          if ((flag != 0) && (bVar2 = false, (char)*_num_print != '\0')) {
            bVar2 = iter._4_4_ < buf_size;
          }
          if (!bVar2) break;
          buf[iter._4_4_] = (char)*_num_print;
          _num_print = (int *)((long)_num_print + 1);
          iter._4_4_ = iter._4_4_ + 1;
        }
        if ((result & 1U) != 0) {
          while (0 < cur_width && iter._4_4_ < buf_size) {
            buf[iter._4_4_] = ' ';
            cur_width = cur_width + -1;
            iter._4_4_ = iter._4_4_ + 1;
          }
        }
      }
      else if ((((*end == 'o') || (*end == 'x')) || (*end == 'X')) || (*end == 'u')) {
        padding_1 = 0;
        if ((int)flag < 1) {
          local_258 = 1;
        }
        else {
          local_258 = flag;
        }
        if (len < 0) {
          local_25c = 0;
        }
        else {
          local_25c = len;
        }
        if (*end == 'o') {
          local_260 = 8;
        }
        else {
          local_260 = 0x10;
          if (*end == 'u') {
            local_260 = 10;
          }
        }
        if (*end == 'x') {
          local_268 = "0123456789abcdef";
        }
        else {
          local_268 = "0123456789ABCDEF";
        }
        if (width == 0) {
          uVar1 = args->gp_offset;
          if (uVar1 < 0x29) {
            local_280 = (uint *)((long)(int)uVar1 + (long)args->reg_save_area);
            args->gp_offset = uVar1 + 8;
          }
          else {
            local_280 = (uint *)args->overflow_arg_area;
            args->overflow_arg_area = local_280 + 2;
          }
          _num_print_1 = (ulong)(*local_280 & 0xff);
        }
        else if (width == 1) {
          uVar1 = args->gp_offset;
          if (uVar1 < 0x29) {
            local_298 = (uint *)((long)(int)uVar1 + (long)args->reg_save_area);
            args->gp_offset = uVar1 + 8;
          }
          else {
            local_298 = (uint *)args->overflow_arg_area;
            args->overflow_arg_area = local_298 + 2;
          }
          _num_print_1 = (ulong)(*local_298 & 0xffff);
        }
        else if (width == 3) {
          uVar1 = args->gp_offset;
          if (uVar1 < 0x29) {
            local_2b0 = (ulong *)((long)(int)uVar1 + (long)args->reg_save_area);
            args->gp_offset = uVar1 + 8;
          }
          else {
            local_2b0 = (ulong *)args->overflow_arg_area;
            args->overflow_arg_area = local_2b0 + 1;
          }
          _num_print_1 = *local_2b0;
        }
        else {
          uVar1 = args->gp_offset;
          if (uVar1 < 0x29) {
            local_2c8 = (uint *)((long)(int)uVar1 + (long)args->reg_save_area);
            args->gp_offset = uVar1 + 8;
          }
          else {
            local_2c8 = (uint *)args->overflow_arg_area;
            args->overflow_arg_area = local_2c8 + 2;
          }
          _num_print_1 = (ulong)*local_2c8;
        }
        do {
          if (padding_1 < 0x40) {
            *(char *)((long)&precision + (long)padding_1) =
                 local_268[_num_print_1 % (ulong)local_260];
            padding_1 = padding_1 + 1;
          }
          _num_print_1 = _num_print_1 / local_260;
        } while (_num_print_1 != 0);
        if ((int)local_258 < padding_1) {
          local_2d4 = padding_1;
        }
        else {
          local_2d4 = local_258;
        }
        cur_precision_1 = local_2d4;
        if ((int)local_258 < padding_1) {
          local_2dc = padding_1;
        }
        else {
          local_2dc = local_258;
        }
        if ((int)(local_25c - local_2dc) < 0) {
          local_2e0 = 0;
        }
        else {
          if ((int)local_258 < padding_1) {
            local_2e8 = padding_1;
          }
          else {
            local_2e8 = local_258;
          }
          local_2e0 = local_25c - local_2e8;
        }
        cur_width_1 = local_2e0;
        if ((result & 0x10U) != 0) {
          if (local_2e0 + -1 < 0) {
            local_2ec = 0;
          }
          else {
            local_2ec = local_2e0 + -1;
          }
          cur_width_1 = local_2ec;
        }
        if ((result & 1U) == 0) {
          for (; iVar4 = cur_width_1 + -1, bVar2 = 0 < cur_width_1, cur_width_1 = iVar4,
              bVar2 && iter._4_4_ < buf_size; iter._4_4_ = iter._4_4_ + 1) {
            if (((result & 0x20U) == 0) || (flag != 0xffffffff)) {
              buf[iter._4_4_] = ' ';
            }
            else {
              buf[iter._4_4_] = '0';
            }
          }
        }
        if ((local_2d4 != 0) && ((result & 0x10U) != 0)) {
          if ((*end == 'o') && (iter._4_4_ < buf_size)) {
            buf[iter._4_4_] = '0';
            iter._4_4_ = iter._4_4_ + 1;
          }
          else if ((*end == 'x') && (iter._4_4_ + 1 < buf_size)) {
            iVar4 = iter._4_4_ + 1;
            buf[iter._4_4_] = '0';
            iter._4_4_ = iter._4_4_ + 2;
            buf[iVar4] = 'x';
          }
          else if ((*end == 'X') && (iter._4_4_ + 1 < buf_size)) {
            iVar4 = iter._4_4_ + 1;
            buf[iter._4_4_] = '0';
            iter._4_4_ = iter._4_4_ + 2;
            buf[iVar4] = 'X';
          }
        }
        while( true ) {
          bVar2 = false;
          if ((flag != 0) && (bVar2 = false, padding_1 < cur_precision_1)) {
            bVar2 = iter._4_4_ < buf_size;
          }
          if (!bVar2) break;
          buf[iter._4_4_] = '0';
          cur_precision_1 = cur_precision_1 + -1;
          iter._4_4_ = iter._4_4_ + 1;
        }
        for (; 0 < padding_1; padding_1 = padding_1 + -1) {
          if ((flag != 0) && (iter._4_4_ < buf_size)) {
            buf[iter._4_4_] = *(char *)((long)&precision + (long)(padding_1 + -1));
            iter._4_4_ = iter._4_4_ + 1;
          }
        }
        if ((result & 1U) != 0) {
          while (0 < cur_width_1 && iter._4_4_ < buf_size) {
            buf[iter._4_4_] = ' ';
            cur_width_1 = cur_width_1 + -1;
            iter._4_4_ = iter._4_4_ + 1;
          }
        }
      }
      else {
        if (*end != 'f') {
          __assert_fail("0 && \"specifier is not supported!\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                        ,0x1bd3,
                        "int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
        }
        if ((int)flag < 0) {
          local_2f4 = 6;
        }
        else {
          local_2f4 = flag;
        }
        if (len < 0) {
          local_2f8 = 0;
        }
        else {
          local_2f8 = len;
        }
        uVar1 = args->fp_offset;
        if (uVar1 < 0xa1) {
          local_318 = (double *)((long)(int)uVar1 + (long)args->reg_save_area);
          args->fp_offset = uVar1 + 0x10;
        }
        else {
          local_318 = (double *)args->overflow_arg_area;
          args->overflow_arg_area = local_318 + 1;
        }
        n_00 = *local_318;
        padding_2 = 0;
        bVar2 = false;
        if (width != 2) {
          __assert_fail("arg_type == NK_ARG_TYPE_DEFAULT",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                        ,0x1b9b,
                        "int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
        }
        nk_dtoa((char *)&precision,n_00);
        iVar4 = nk_strlen((char *)&precision);
        _prefix = &precision;
        while( true ) {
          bVar6 = false;
          if ((char)*_prefix != '\0') {
            bVar6 = (char)*_prefix != '.';
          }
          if (!bVar6) break;
          _prefix = (int *)((long)_prefix + 1);
        }
        if ((char)*_prefix == '.') {
          local_320 = ((int)_prefix - (int)&precision) + 1;
        }
        else {
          local_320 = 0;
        }
        if ((int)local_2f4 < iVar4 - local_320) {
          local_32c = local_2f4;
        }
        else {
          local_32c = iVar4 - local_320;
        }
        if ((int)(local_2f8 - (local_320 + local_32c)) < 0) {
          local_330 = 0;
        }
        else {
          if ((int)local_2f4 < iVar4 - local_320) {
            local_33c = local_2f4;
          }
          else {
            local_33c = iVar4 - local_320;
          }
          local_330 = local_2f8 - (local_320 + local_33c);
        }
        local_150 = local_330;
        if (((result & 2U) != 0) || ((result & 4U) != 0)) {
          if (local_330 + -1 < 0) {
            local_340 = 0;
          }
          else {
            local_340 = local_330 + -1;
          }
          local_150 = local_340;
        }
        if ((result & 1U) == 0) {
          for (; iVar4 = local_150 + -1, bVar6 = 0 < local_150, local_150 = iVar4,
              bVar6 && iter._4_4_ < buf_size; iter._4_4_ = iter._4_4_ + 1) {
            if ((result & 0x20U) == 0) {
              buf[iter._4_4_] = ' ';
            }
            else {
              buf[iter._4_4_] = '0';
            }
          }
        }
        _prefix = &precision;
        if ((((result & 2U) == 0) || (n_00 < 0.0)) || (buf_size <= iter._4_4_)) {
          if ((((result & 4U) != 0) && (0.0 <= n_00)) && (iter._4_4_ < buf_size)) {
            buf[iter._4_4_] = ' ';
            iter._4_4_ = iter._4_4_ + 1;
          }
        }
        else {
          buf[iter._4_4_] = '+';
          iter._4_4_ = iter._4_4_ + 1;
        }
        for (; (char)*_prefix != '\0'; _prefix = (int *)((long)_prefix + 1)) {
          if (bVar2) {
            padding_2 = padding_2 + 1;
          }
          if (iter._4_4_ < buf_size) {
            buf[iter._4_4_] = (char)*_prefix;
            iter._4_4_ = iter._4_4_ + 1;
          }
          if ((char)*_prefix == '.') {
            bVar2 = true;
          }
          if ((int)local_2f4 <= padding_2) break;
        }
        for (; padding_2 < (int)local_2f4; padding_2 = padding_2 + 1) {
          if ((!bVar2) && (iter._4_4_ < buf_size)) {
            buf[iter._4_4_] = '.';
            bVar2 = true;
            iter._4_4_ = iter._4_4_ + 1;
          }
          if (iter._4_4_ < buf_size) {
            buf[iter._4_4_] = '0';
            iter._4_4_ = iter._4_4_ + 1;
          }
        }
        if ((result & 1U) != 0) {
          while (0 < local_150 && iter._4_4_ < buf_size) {
            buf[iter._4_4_] = ' ';
            local_150 = local_150 + -1;
            iter._4_4_ = iter._4_4_ + 1;
          }
        }
      }
    }
    if (iter._4_4_ < buf_size) {
      local_354 = iter._4_4_;
    }
    else {
      local_354 = buf_size + -1;
    }
    buf[local_354] = '\0';
    if (iter._4_4_ < buf_size) {
      local_358 = iter._4_4_;
    }
    else {
      local_358 = -1;
    }
    buf_local._4_4_ = local_358;
  }
  return buf_local._4_4_;
}

Assistant:

NK_INTERN int
nk_vsnprintf(char *buf, int buf_size, const char *fmt, va_list args)
{
    enum nk_arg_type {
        NK_ARG_TYPE_CHAR,
        NK_ARG_TYPE_SHORT,
        NK_ARG_TYPE_DEFAULT,
        NK_ARG_TYPE_LONG
    };
    enum nk_arg_flags {
        NK_ARG_FLAG_LEFT = 0x01,
        NK_ARG_FLAG_PLUS = 0x02,
        NK_ARG_FLAG_SPACE = 0x04,
        NK_ARG_FLAG_NUM = 0x10,
        NK_ARG_FLAG_ZERO = 0x20
    };

    char number_buffer[NK_MAX_NUMBER_BUFFER];
    enum nk_arg_type arg_type = NK_ARG_TYPE_DEFAULT;
    int precision = NK_DEFAULT;
    int width = NK_DEFAULT;
    nk_flags flag = 0;

    int len = 0;
    int result = -1;
    const char *iter = fmt;

    NK_ASSERT(buf);
    NK_ASSERT(buf_size);
    if (!buf || !buf_size || !fmt) return 0;
    for (iter = fmt; *iter && len < buf_size; iter++) {
        /* copy all non-format characters */
        while (*iter && (*iter != '%') && (len < buf_size))
            buf[len++] = *iter++;
        if (!(*iter) || len >= buf_size) break;
        iter++;

        /* flag arguments */
        while (*iter) {
            if (*iter == '-') flag |= NK_ARG_FLAG_LEFT;
            else if (*iter == '+') flag |= NK_ARG_FLAG_PLUS;
            else if (*iter == ' ') flag |= NK_ARG_FLAG_SPACE;
            else if (*iter == '#') flag |= NK_ARG_FLAG_NUM;
            else if (*iter == '0') flag |= NK_ARG_FLAG_ZERO;
            else break;
            iter++;
        }

        /* width argument */
        width = NK_DEFAULT;
        if (*iter >= '1' && *iter <= '9') {
            const char *end;
            width = nk_strtoi(iter, &end);
            if (end == iter)
                width = -1;
            else iter = end;
        } else if (*iter == '*') {
            width = va_arg(args, int);
            iter++;
        }

        /* precision argument */
        precision = NK_DEFAULT;
        if (*iter == '.') {
            iter++;
            if (*iter == '*') {
                precision = va_arg(args, int);
                iter++;
            } else {
                const char *end;
                precision = nk_strtoi(iter, &end);
                if (end == iter)
                    precision = -1;
                else iter = end;
            }
        }

        /* length modifier */
        if (*iter == 'h') {
            if (*(iter+1) == 'h') {
                arg_type = NK_ARG_TYPE_CHAR;
                iter++;
            } else arg_type = NK_ARG_TYPE_SHORT;
            iter++;
        } else if (*iter == 'l') {
            arg_type = NK_ARG_TYPE_LONG;
            iter++;
        } else arg_type = NK_ARG_TYPE_DEFAULT;

        /* specifier */
        if (*iter == '%') {
            NK_ASSERT(arg_type == NK_ARG_TYPE_DEFAULT);
            NK_ASSERT(precision == NK_DEFAULT);
            NK_ASSERT(width == NK_DEFAULT);
            if (len < buf_size)
                buf[len++] = '%';
        } else if (*iter == 's') {
            /* string  */
            const char *str = va_arg(args, const char*);
            NK_ASSERT(str != buf && "buffer and argument are not allowed to overlap!");
            NK_ASSERT(arg_type == NK_ARG_TYPE_DEFAULT);
            NK_ASSERT(precision == NK_DEFAULT);
            NK_ASSERT(width == NK_DEFAULT);
            if (str == buf) return -1;
            while (str && *str && len < buf_size)
                buf[len++] = *str++;
        } else if (*iter == 'n') {
            /* current length callback */
            signed int *n = va_arg(args, int*);
            NK_ASSERT(arg_type == NK_ARG_TYPE_DEFAULT);
            NK_ASSERT(precision == NK_DEFAULT);
            NK_ASSERT(width == NK_DEFAULT);
            if (n) *n = len;
        } else if (*iter == 'c' || *iter == 'i' || *iter == 'd') {
            /* signed integer */
            long value = 0;
            const char *num_iter;
            int num_len, num_print, padding;
            int cur_precision = NK_MAX(precision, 1);
            int cur_width = NK_MAX(width, 0);

            /* retrieve correct value type */
            if (arg_type == NK_ARG_TYPE_CHAR)
                value = (signed char)va_arg(args, int);
            else if (arg_type == NK_ARG_TYPE_SHORT)
                value = (signed short)va_arg(args, int);
            else if (arg_type == NK_ARG_TYPE_LONG)
                value = va_arg(args, signed long);
            else if (*iter == 'c')
                value = (unsigned char)va_arg(args, int);
            else value = va_arg(args, signed int);

            /* convert number to string */
            nk_itoa(number_buffer, value);
            num_len = nk_strlen(number_buffer);
            padding = NK_MAX(cur_width - NK_MAX(cur_precision, num_len), 0);
            if ((flag & NK_ARG_FLAG_PLUS) || (flag & NK_ARG_FLAG_SPACE))
                padding = NK_MAX(padding-1, 0);

            /* fill left padding up to a total of `width` characters */
            if (!(flag & NK_ARG_FLAG_LEFT)) {
                while (padding-- > 0 && (len < buf_size)) {
                    if ((flag & NK_ARG_FLAG_ZERO) && (precision == NK_DEFAULT))
                        buf[len++] = '0';
                    else buf[len++] = ' ';
                }
            }

            /* copy string value representation into buffer */
            if ((flag & NK_ARG_FLAG_PLUS) && value >= 0 && len < buf_size)
                buf[len++] = '+';
            else if ((flag & NK_ARG_FLAG_SPACE) && value >= 0 && len < buf_size)
                buf[len++] = ' ';

            /* fill up to precision number of digits with '0' */
            num_print = NK_MAX(cur_precision, num_len);
            while (precision && (num_print > num_len) && (len < buf_size)) {
                buf[len++] = '0';
                num_print--;
            }

            /* copy string value representation into buffer */
            num_iter = number_buffer;
            while (precision && *num_iter && len < buf_size)
                buf[len++] = *num_iter++;

            /* fill right padding up to width characters */
            if (flag & NK_ARG_FLAG_LEFT) {
                while ((padding-- > 0) && (len < buf_size))
                    buf[len++] = ' ';
            }
        } else if (*iter == 'o' || *iter == 'x' || *iter == 'X' || *iter == 'u') {
            /* unsigned integer */
            unsigned long value = 0;
            int num_len = 0, num_print, padding = 0;
            int cur_precision = NK_MAX(precision, 1);
            int cur_width = NK_MAX(width, 0);
            unsigned int base = (*iter == 'o') ? 8: (*iter == 'u')? 10: 16;

            /* print oct/hex/dec value */
            const char *upper_output_format = "0123456789ABCDEF";
            const char *lower_output_format = "0123456789abcdef";
            const char *output_format = (*iter == 'x') ?
                lower_output_format: upper_output_format;

            /* retrieve correct value type */
            if (arg_type == NK_ARG_TYPE_CHAR)
                value = (unsigned char)va_arg(args, int);
            else if (arg_type == NK_ARG_TYPE_SHORT)
                value = (unsigned short)va_arg(args, int);
            else if (arg_type == NK_ARG_TYPE_LONG)
                value = va_arg(args, unsigned long);
            else value = va_arg(args, unsigned int);

            do {
                /* convert decimal number into hex/oct number */
                int digit = output_format[value % base];
                if (num_len < NK_MAX_NUMBER_BUFFER)
                    number_buffer[num_len++] = (char)digit;
                value /= base;
            } while (value > 0);

            num_print = NK_MAX(cur_precision, num_len);
            padding = NK_MAX(cur_width - NK_MAX(cur_precision, num_len), 0);
            if (flag & NK_ARG_FLAG_NUM)
                padding = NK_MAX(padding-1, 0);

            /* fill left padding up to a total of `width` characters */
            if (!(flag & NK_ARG_FLAG_LEFT)) {
                while ((padding-- > 0) && (len < buf_size)) {
                    if ((flag & NK_ARG_FLAG_ZERO) && (precision == NK_DEFAULT))
                        buf[len++] = '0';
                    else buf[len++] = ' ';
                }
            }

            /* fill up to precision number of digits */
            if (num_print && (flag & NK_ARG_FLAG_NUM)) {
                if ((*iter == 'o') && (len < buf_size)) {
                    buf[len++] = '0';
                } else if ((*iter == 'x') && ((len+1) < buf_size)) {
                    buf[len++] = '0';
                    buf[len++] = 'x';
                } else if ((*iter == 'X') && ((len+1) < buf_size)) {
                    buf[len++] = '0';
                    buf[len++] = 'X';
                }
            }
            while (precision && (num_print > num_len) && (len < buf_size)) {
                buf[len++] = '0';
                num_print--;
            }

            /* reverse number direction */
            while (num_len > 0) {
                if (precision && (len < buf_size))
                    buf[len++] = number_buffer[num_len-1];
                num_len--;
            }

            /* fill right padding up to width characters */
            if (flag & NK_ARG_FLAG_LEFT) {
                while ((padding-- > 0) && (len < buf_size))
                    buf[len++] = ' ';
            }
        } else if (*iter == 'f') {
            /* floating point */
            const char *num_iter;
            int cur_precision = (precision < 0) ? 6: precision;
            int prefix, cur_width = NK_MAX(width, 0);
            double value = va_arg(args, double);
            int num_len = 0, frac_len = 0, dot = 0;
            int padding = 0;

            NK_ASSERT(arg_type == NK_ARG_TYPE_DEFAULT);
            NK_DTOA(number_buffer, value);
            num_len = nk_strlen(number_buffer);

            /* calculate padding */
            num_iter = number_buffer;
            while (*num_iter && *num_iter != '.')
                num_iter++;

            prefix = (*num_iter == '.')?(int)(num_iter - number_buffer)+1:0;
            padding = NK_MAX(cur_width - (prefix + NK_MIN(cur_precision, num_len - prefix)) , 0);
            if ((flag & NK_ARG_FLAG_PLUS) || (flag & NK_ARG_FLAG_SPACE))
                padding = NK_MAX(padding-1, 0);

            /* fill left padding up to a total of `width` characters */
            if (!(flag & NK_ARG_FLAG_LEFT)) {
                while (padding-- > 0 && (len < buf_size)) {
                    if (flag & NK_ARG_FLAG_ZERO)
                        buf[len++] = '0';
                    else buf[len++] = ' ';
                }
            }

            /* copy string value representation into buffer */
            num_iter = number_buffer;
            if ((flag & NK_ARG_FLAG_PLUS) && (value >= 0) && (len < buf_size))
                buf[len++] = '+';
            else if ((flag & NK_ARG_FLAG_SPACE) && (value >= 0) && (len < buf_size))
                buf[len++] = ' ';
            while (*num_iter) {
                if (dot) frac_len++;
                if (len < buf_size)
                    buf[len++] = *num_iter;
                if (*num_iter == '.') dot = 1;
                if (frac_len >= cur_precision) break;
                num_iter++;
            }

            /* fill number up to precision */
            while (frac_len < cur_precision) {
                if (!dot && len < buf_size) {
                    buf[len++] = '.';
                    dot = 1;
                }
                if (len < buf_size)
                    buf[len++] = '0';
                frac_len++;
            }

            /* fill right padding up to width characters */
            if (flag & NK_ARG_FLAG_LEFT) {
                while ((padding-- > 0) && (len < buf_size))
                    buf[len++] = ' ';
            }
        } else {
            /* Specifier not supported: g,G,e,E,p,z */
            NK_ASSERT(0 && "specifier is not supported!");
            return result;
        }
    }
    buf[(len >= buf_size)?(buf_size-1):len] = 0;
    result = (len >= buf_size)?-1:len;
    return result;
}